

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void cnn::TensorTools::Randomize(Tensor *val,real scale)

{
  long in_RDI;
  anon_class_8_1_c254ac82 b;
  uniform_real_distribution<float> distribution;
  undefined8 in_stack_ffffffffffffffc8;
  float *__first;
  uniform_real_distribution<float> *in_stack_ffffffffffffffd0;
  anon_class_8_1_c254ac82 __gen;
  
  std::uniform_real_distribution<float>::uniform_real_distribution
            (in_stack_ffffffffffffffd0,(float)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (float)in_stack_ffffffffffffffc8);
  __gen.distribution = *(uniform_real_distribution<float> **)(in_RDI + 0x28);
  __first = *(float **)(in_RDI + 0x28);
  Dim::size((Dim *)__gen.distribution);
  std::generate<float*,cnn::TensorTools::Randomize(cnn::Tensor&,float)::__0>
            (__first,(float *)0x6bb6a7,__gen);
  return;
}

Assistant:

void TensorTools::Randomize(Tensor& val, real scale) {
  uniform_real_distribution<real> distribution(-scale,scale);
  auto b = [&] {return distribution(*rndeng);};
#if HAVE_CUDA
  float* t = new float[val.d.size()];
  generate(t, t + val.d.size(), b);
  CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
  delete[] t;
#else
  generate(val.v, val.v + val.d.size(), b);
#endif
}